

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks.c
# Opt level: O2

CURLcode socks_proxy_cf_connect(Curl_cfilter *cf,Curl_easy *data,_Bool *done)

{
  uchar *puVar1;
  byte bVar2;
  connectdata *conn;
  connectdata *pcVar3;
  sockaddr *psVar4;
  curl_trc_feat *pcVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  _Bool _Var9;
  ushort uVar10;
  CURLcode CVar11;
  uint uVar12;
  int iVar13;
  CURLproxycode CVar14;
  socks_state *sx;
  long lVar15;
  size_t sVar16;
  size_t __n;
  char *pcVar17;
  uchar uVar18;
  long lVar19;
  int code;
  Curl_dns_entry *pCVar20;
  ulong uVar21;
  Curl_addrinfo *pCVar22;
  char *pcVar23;
  ulong uVar24;
  connect_t cVar25;
  ssize_t sVar26;
  Curl_dns_entry *dns;
  char *local_98;
  char *local_90;
  uchar ip4 [4];
  char dest [46];
  
  if ((cf->field_0x24 & 1) != 0) {
    CVar11 = CURLE_OK;
    _Var9 = true;
    goto LAB_0015481e;
  }
  sx = (socks_state *)cf->ctx;
  conn = cf->conn;
  iVar13 = cf->sockindex;
  CVar11 = (*(code *)cf->next->cft->do_connect)(cf->next,data,done);
  if (CVar11 != CURLE_OK) {
    return CVar11;
  }
  if (*done != true) {
    return CURLE_OK;
  }
  if (sx == (socks_state *)0x0) {
    sx = (socks_state *)(*Curl_ccalloc)(1,0x290);
    if (sx == (socks_state *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    cf->ctx = sx;
  }
  cVar25 = sx->state;
  if (cVar25 == CONNECT_INIT) {
    sx->state = CONNECT_SOCKS_INIT;
    lVar15 = 0x138;
    if (((((ulong)conn->bits & 1) == 0) && (lVar15 = 0xe0, (SUB84(conn->bits,0) >> 8 & 1) == 0)) &&
       (lVar15 = 0xb0, iVar13 == 1)) {
      lVar15 = 200;
    }
    sx->hostname = *(char **)((long)&(conn->cpool_node)._list + lVar15);
    if (((ulong)conn->bits & 1) == 0) {
      if (iVar13 == 1) {
        uVar12 = (uint)conn->secondary_port;
      }
      else if ((SUB84(conn->bits,0) >> 9 & 1) == 0) {
        uVar12 = conn->remote_port;
      }
      else {
        uVar12 = conn->conn_to_port;
      }
    }
    else {
      uVar12 = (conn->http_proxy).port;
    }
    sx->remote_port = uVar12;
    uVar6 = *(undefined4 *)((long)&(conn->socks_proxy).user + 4);
    uVar7 = *(undefined4 *)&(conn->socks_proxy).passwd;
    uVar8 = *(undefined4 *)((long)&(conn->socks_proxy).passwd + 4);
    *(undefined4 *)&sx->proxy_user = *(undefined4 *)&(conn->socks_proxy).user;
    *(undefined4 *)((long)&sx->proxy_user + 4) = uVar6;
    *(undefined4 *)&sx->proxy_password = uVar7;
    *(undefined4 *)((long)&sx->proxy_password + 4) = uVar8;
    cVar25 = CONNECT_SOCKS_INIT;
  }
  pcVar3 = cf->conn;
  bVar2 = (pcVar3->socks_proxy).proxytype;
  switch(bVar2) {
  case 4:
  case 6:
    break;
  case 5:
  case 7:
    pcVar23 = sx->hostname;
    local_90 = (char *)(ulong)bVar2;
    sVar16 = strlen(pcVar23);
    bVar2 = (data->set).socks5auth;
    pcVar17 = (char *)(ulong)bVar2;
    dns = (Curl_dns_entry *)0x0;
    lVar15 = 0;
    if (0xf < cVar25 - CONNECT_SOCKS_INIT) {
switchD_0015499a_caseD_5:
      if (((data->set).field_0x89f & 0x40) == 0) {
LAB_00155be9:
        CVar14 = CURLPX_OK;
      }
      else {
        pcVar5 = (data->state).feat;
        if ((pcVar5 == (curl_trc_feat *)0x0) || (CVar14 = CURLPX_OK, 0 < pcVar5->log_level)) {
          Curl_infof(data,"SOCKS5 request granted.");
          CVar14 = CURLPX_OK;
        }
      }
      goto LAB_00155b7c;
    }
    puVar1 = sx->buffer;
    switch(cVar25) {
    case CONNECT_SOCKS_INIT:
      if (((((ulong)pcVar3->bits & 1) != 0) && (((data->set).field_0x89f & 0x40) != 0)) &&
         ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 || (0 < pcVar5->log_level))))
      {
        Curl_infof(data,"SOCKS5: connecting to HTTP proxy %s port %d",pcVar23);
      }
      if (((char)local_90 == '\x05') || (sVar16 < 0x100)) {
        if ((((bVar2 & 0xfa) != 0) && (((data->set).field_0x89f & 0x40) != 0)) &&
           ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 || (0 < pcVar5->log_level))
           )) {
          local_98 = pcVar17;
          Curl_infof(data,"warning: unsupported value passed to CURLOPT_SOCKS5_AUTH: %u",pcVar17);
          pcVar17 = local_98;
        }
        if (((ulong)pcVar17 & 1) == 0) {
          sx->proxy_user = (char *)0x0;
          sx->buffer[0] = '\x05';
          sVar26 = 3;
          lVar15 = 0x12;
          uVar18 = '\0';
LAB_00155163:
          sx->buffer[lVar15 + -0x10] = uVar18;
        }
        else {
          pcVar23 = sx->proxy_user;
          sx->buffer[0] = '\x05';
          sx->buffer[2] = '\0';
          if (pcVar23 != (char *)0x0) {
            sVar26 = 4;
            uVar18 = '\x02';
            lVar15 = 0x13;
            goto LAB_00155163;
          }
          sVar26 = 3;
        }
        sx->buffer[1] = (char)sVar26 + 0xfe;
        sx->outp = puVar1;
        sx->outstanding = sVar26;
        CVar14 = socks_state_send(cf,sx,data,CURLPX_SEND_CONNECT,"initial SOCKS5 request");
        if (CVar14 == CURLPX_OK) {
          if (sx->outstanding == 0) {
            if (sx->state != CONNECT_SOCKS_READ) {
              sx->state = CONNECT_SOCKS_READ;
            }
            goto switchD_0015499a_caseD_3;
          }
          CVar14 = CURLPX_OK;
        }
      }
      else {
        Curl_failf(data,
                   "SOCKS5: the destination hostname is too long to be resolved remotely by the proxy."
                  );
        CVar14 = CURLPX_LONG_HOSTNAME;
      }
      goto LAB_00155b7c;
    case CONNECT_SOCKS_SEND:
      CVar14 = socks_state_send(cf,sx,data,CURLPX_SEND_CONNECT,"initial SOCKS5 request");
      if (CVar14 != CURLPX_OK) goto LAB_00155b7c;
      if (sx->outstanding == 0) goto switchD_0015499a_caseD_3;
      goto LAB_00155be9;
    case CONNECT_SOCKS_READ_INIT:
switchD_0015499a_caseD_3:
      sx->outstanding = 2;
      sx->outp = puVar1;
      break;
    case CONNECT_GSSAPI_INIT:
      goto switchD_0015499a_caseD_5;
    case CONNECT_AUTH_INIT:
      goto switchD_0015499a_caseD_6;
    case CONNECT_AUTH_SEND:
      goto switchD_0015499a_caseD_7;
    case CONNECT_AUTH_READ:
      goto switchD_0015499a_caseD_8;
    case CONNECT_REQ_INIT:
      goto switchD_0015499a_caseD_9;
    case CONNECT_RESOLVING:
      CVar14 = CURLPX_RESOLVE_HOST;
      CVar11 = Curl_resolv_check(data,&dns);
      if (dns == (Curl_dns_entry *)0x0) {
        if (CVar11 == CURLE_OK) {
          CVar14 = CURLPX_OK;
        }
        goto LAB_00155b7c;
      }
      goto LAB_00154c15;
    case CONNECT_RESOLVED:
      goto switchD_0015499a_caseD_b;
    case CONNECT_RESOLVE_REMOTE:
      sx->buffer[0] = '\x05';
      sx->buffer[1] = '\x01';
      sx->buffer[2] = '\0';
      if ((char)local_90 == '\x05') {
        lVar15 = 3;
        goto switchD_0015499a_caseD_d;
      }
      goto LAB_00155609;
    case CONNECT_REQ_SEND:
      goto switchD_0015499a_caseD_d;
    case CONNECT_REQ_SENDING:
      goto switchD_0015499a_caseD_e;
    case CONNECT_REQ_READ:
      goto switchD_0015499a_caseD_f;
    case CONNECT_REQ_READ_MORE:
      goto switchD_0015499a_caseD_10;
    }
    CVar14 = socks_state_recv(cf,sx,data,CURLPX_RECV_CONNECT,"initial SOCKS5 response");
    if (CVar14 != CURLPX_OK) goto LAB_00155b7c;
    if (sx->outstanding != 0) {
LAB_0015559b:
      CVar14 = CURLPX_OK;
      goto LAB_00155b7c;
    }
    if (*puVar1 != '\x05') {
      Curl_failf(data,"Received invalid version in initial SOCKS5 response.");
      goto LAB_00154f6e;
    }
    uVar18 = sx->buffer[1];
    if (uVar18 == 0xff) {
      Curl_failf(data,"No authentication method was acceptable.");
      CVar14 = CURLPX_NO_AUTH;
      goto LAB_00155b7c;
    }
    if (uVar18 == '\x01') {
      Curl_failf(data,"SOCKS5 GSSAPI per-message authentication is not supported.");
      CVar14 = CURLPX_GSSAPI_PERMSG;
      goto LAB_00155b7c;
    }
    if (uVar18 == '\x02') {
      if (sx->state != CONNECT_AUTH_INIT) {
        sx->state = CONNECT_AUTH_INIT;
      }
switchD_0015499a_caseD_6:
      pcVar23 = sx->proxy_user;
      if ((pcVar23 == (char *)0x0) || (pcVar17 = sx->proxy_password, pcVar17 == (char *)0x0)) {
        __n = 0;
        pcVar17 = (char *)0x0;
      }
      else {
        local_98 = pcVar23;
        __n = strlen(pcVar23);
        pcVar17 = (char *)strlen(pcVar17);
        pcVar23 = local_98;
      }
      sx->buffer[0] = '\x01';
      sx->buffer[1] = (uchar)__n;
      if (__n != 0 && pcVar23 != (char *)0x0) {
        if (0xff < __n) {
          Curl_failf(data,"Excessive username length for proxy auth");
          CVar14 = CURLPX_LONG_USER;
          goto LAB_00155b7c;
        }
        local_98 = pcVar17;
        memcpy(sx->buffer + 2,pcVar23,__n);
        pcVar17 = local_98;
      }
      sx->buffer[__n + 2] = (uchar)pcVar17;
      if (pcVar17 != (char *)0x0 && sx->proxy_password != (char *)0x0) {
        if ((char *)0xff < pcVar17) {
          CVar14 = CURLPX_LONG_PASSWD;
          Curl_failf(data,"Excessive password length for proxy auth");
          goto LAB_00155b7c;
        }
        local_98 = pcVar17;
        memcpy(puVar1 + __n + 3,sx->proxy_password,(size_t)pcVar17);
        pcVar17 = local_98;
      }
      if (sx->state != CONNECT_AUTH_SEND) {
        sx->state = CONNECT_AUTH_SEND;
      }
      sx->outstanding = (ssize_t)(pcVar17 + __n + 3);
      sx->outp = puVar1;
switchD_0015499a_caseD_7:
      CVar14 = socks_state_send(cf,sx,data,CURLPX_SEND_AUTH,"SOCKS5 sub-negotiation request");
      if (CVar14 == CURLPX_OK) {
        if (sx->outstanding == 0) {
          sx->outp = puVar1;
          sx->outstanding = 2;
          if (sx->state != CONNECT_AUTH_READ) {
            sx->state = CONNECT_AUTH_READ;
          }
switchD_0015499a_caseD_8:
          CVar14 = socks_state_recv(cf,sx,data,CURLPX_RECV_AUTH,"SOCKS5 sub-negotiation response");
          if (CVar14 == CURLPX_OK) {
            if (sx->outstanding != 0) goto LAB_0015559b;
            if (sx->buffer[1] == '\0') {
              cVar25 = sx->state;
              goto LAB_001555e6;
            }
            Curl_failf(data,"User was rejected by the SOCKS5 server (%d %d).",(ulong)*puVar1);
            CVar14 = CURLPX_USER_REJECTED;
          }
        }
        else {
          CVar14 = CURLPX_OK;
        }
      }
      goto LAB_00155b7c;
    }
    if (uVar18 != '\0') {
      Curl_failf(data,"Undocumented SOCKS5 mode attempted to be used by server.");
      CVar14 = CURLPX_UNKNOWN_MODE;
      goto LAB_00155b7c;
    }
    cVar25 = sx->state;
LAB_001555e6:
    if (cVar25 != CONNECT_REQ_INIT) {
      sx->state = CONNECT_REQ_INIT;
    }
switchD_0015499a_caseD_9:
    if ((char)local_90 == '\x05') {
      CVar11 = Curl_resolv(data,sx->hostname,sx->remote_port,(uint)cf->conn->ip_version,true,&dns);
      if (CVar11 == CURLE_OK) {
        if (sx->state != CONNECT_RESOLVED) {
          sx->state = CONNECT_RESOLVED;
        }
        if (dns == (Curl_dns_entry *)0x0) {
switchD_0015499a_caseD_b:
          pCVar22 = (Curl_addrinfo *)0x0;
        }
        else {
LAB_00154c15:
          pCVar22 = dns->addr;
        }
        uVar18 = (data->set).ipver;
        if (uVar18 == '\0') {
          if (pCVar22 != (Curl_addrinfo *)0x0) {
LAB_001557ef:
            Curl_printable_address(pCVar22,dest,0x2e);
            sx->buffer[0] = '\x05';
            sx->buffer[1] = '\x01';
            sx->buffer[2] = '\0';
            if (pCVar22->ai_family == 10) {
              lVar15 = 0x14;
              sx->buffer[3] = '\x04';
              psVar4 = pCVar22->ai_addr;
              for (lVar19 = 0; lVar19 != 0x10; lVar19 = lVar19 + 1) {
                sx->buffer[lVar19 + 4] = psVar4->sa_data[lVar19 + 6];
              }
              if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
                 ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 ||
                  (0 < pcVar5->log_level)))) {
                uVar12 = sx->remote_port;
                pcVar23 = "SOCKS5 connect to [%s]:%d (locally resolved)";
LAB_00155900:
                Curl_infof(data,pcVar23,dest,(ulong)uVar12);
              }
            }
            else if (pCVar22->ai_family == 2) {
              lVar15 = 8;
              sx->buffer[3] = '\x01';
              psVar4 = pCVar22->ai_addr;
              for (lVar19 = 0; lVar19 != 4; lVar19 = lVar19 + 1) {
                sx->buffer[lVar19 + 4] = psVar4->sa_data[lVar19 + 2];
              }
              if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
                 ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 ||
                  (0 < pcVar5->log_level)))) {
                uVar12 = sx->remote_port;
                pcVar23 = "SOCKS5 connect to %s:%d (locally resolved)";
                goto LAB_00155900;
              }
            }
            else {
              Curl_failf(data,"SOCKS5 connection to %s not supported",dest);
              lVar15 = 3;
            }
            Curl_resolv_unlink(data,&dns);
            goto switchD_0015499a_caseD_d;
          }
        }
        else {
          for (; pCVar22 != (Curl_addrinfo *)0x0; pCVar22 = pCVar22->ai_next) {
            if (pCVar22->ai_family == (uint)(uVar18 != '\x01') * 8 + 2) goto LAB_001557ef;
          }
        }
        CVar14 = CURLPX_RESOLVE_HOST;
        Curl_failf(data,"Failed to resolve \"%s\" for SOCKS5 connect.",sx->hostname);
      }
      else {
        CVar14 = CURLPX_RESOLVE_HOST;
        if (CVar11 == CURLE_AGAIN) {
          CVar14 = CURLPX_OK;
          if (sx->state != CONNECT_RESOLVING) {
            sx->state = CONNECT_RESOLVING;
            CVar14 = CURLPX_OK;
          }
        }
      }
      goto LAB_00155b7c;
    }
    sx->buffer[0] = '\x05';
    sx->buffer[1] = '\x01';
    sx->buffer[2] = '\0';
LAB_00155609:
    if (((pcVar3->bits).field_0x1 & 4) == 0) {
      iVar13 = inet_pton(2,sx->hostname,ip4);
      if (iVar13 == 1) {
        sx->buffer[3] = '\x01';
        *(uchar (*) [4])(sx->buffer + 4) = ip4;
        lVar15 = 8;
      }
      else {
        sx->buffer[3] = '\x03';
        sx->buffer[4] = (uchar)sVar16;
        memcpy(sx->buffer + 5,sx->hostname,sVar16);
        lVar15 = sVar16 + 5;
      }
    }
    else {
      iVar13 = inet_pton(10,sx->hostname,dest);
      if (iVar13 != 1) {
        CVar14 = CURLPX_BAD_ADDRESS_TYPE;
        goto LAB_00155b7c;
      }
      sx->buffer[3] = '\x04';
      *(undefined4 *)(sx->buffer + 4) = dest._0_4_;
      *(undefined4 *)(sx->buffer + 8) = dest._4_4_;
      *(undefined4 *)(sx->buffer + 0xc) = dest._8_4_;
      *(undefined4 *)(sx->buffer + 0x10) = dest._12_4_;
      lVar15 = 0x14;
    }
    if ((((data->set).field_0x89f & 0x40) != 0) &&
       ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 || (0 < pcVar5->log_level)))) {
      Curl_infof(data,"SOCKS5 connect to %s:%d (remotely resolved)",sx->hostname,
                 (ulong)(uint)sx->remote_port);
    }
switchD_0015499a_caseD_d:
    sx->buffer[lVar15] = *(uchar *)((long)&sx->remote_port + 1);
    sx->buffer[lVar15 + 1] = (uchar)sx->remote_port;
    sx->outp = puVar1;
    sx->outstanding = lVar15 + 2;
    if (sx->state != CONNECT_REQ_SENDING) {
      sx->state = CONNECT_REQ_SENDING;
    }
switchD_0015499a_caseD_e:
    CVar14 = socks_state_send(cf,sx,data,CURLPX_SEND_REQUEST,"SOCKS5 connect request");
    if (CVar14 != CURLPX_OK) goto LAB_00155b7c;
    if (sx->outstanding == 0) {
      sx->outstanding = 10;
      sx->outp = puVar1;
      if (sx->state != CONNECT_REQ_READ) {
        sx->state = CONNECT_REQ_READ;
      }
switchD_0015499a_caseD_f:
      CVar14 = socks_state_recv(cf,sx,data,CURLPX_RECV_REQACK,"SOCKS5 connect request ack");
      if (CVar14 == CURLPX_OK) {
        if (sx->outstanding != 0) goto LAB_00155b75;
        if (*puVar1 == '\x05') {
          bVar2 = sx->buffer[1];
          if (bVar2 == 0) {
            uVar18 = sx->buffer[3];
            if (uVar18 != '\x01') {
              if (uVar18 == '\x03') {
                if ((ulong)sx->buffer[4] < 4) goto LAB_00155bc9;
                lVar15 = (ulong)sx->buffer[4] + 7;
              }
              else {
                if (uVar18 != '\x04') {
                  Curl_failf(data,"SOCKS5 reply has wrong address type.");
                  CVar14 = CURLPX_BAD_ADDRESS_TYPE;
                  goto LAB_00155b7c;
                }
                lVar15 = 0x16;
              }
              sx->outstanding = lVar15 + -10;
              sx->outp = sx->buffer + 10;
              if (sx->state != CONNECT_REQ_READ_MORE) {
                sx->state = CONNECT_REQ_READ_MORE;
              }
switchD_0015499a_caseD_10:
              CVar14 = socks_state_recv(cf,sx,data,CURLPX_RECV_ADDRESS,
                                        "SOCKS5 connect request address");
              if (CVar14 != CURLPX_OK) goto LAB_00155b7c;
              if (sx->outstanding != 0) goto LAB_00155b75;
            }
LAB_00155bc9:
            if (sx->state != CONNECT_DONE) {
              sx->state = CONNECT_DONE;
            }
            if (data != (Curl_easy *)0x0) goto switchD_0015499a_caseD_5;
            goto LAB_00155be9;
          }
          Curl_failf(data,"cannot complete SOCKS5 connection to %s. (%d)",sx->hostname,(ulong)bVar2)
          ;
          if (bVar2 < 9) {
            CVar14 = *(CURLproxycode *)(do_SOCKS5_lookup + (ulong)bVar2 * 4);
          }
          else {
            CVar14 = CURLPX_REPLY_UNASSIGNED;
          }
        }
        else {
          Curl_failf(data,"SOCKS5 reply has wrong version, version should be 5.");
          CVar14 = CURLPX_BAD_VERSION;
        }
      }
      goto LAB_00155b7c;
    }
    goto LAB_00155b75;
  default:
    Curl_failf(data,"unknown proxytype option given");
    CVar11 = CURLE_COULDNT_CONNECT;
    goto LAB_00155b89;
  }
  dns = (Curl_dns_entry *)0x0;
  puVar1 = sx->buffer;
  switch(cVar25) {
  case CONNECT_SOCKS_INIT:
    pcVar3->ip_version = '\x01';
    if ((data == (Curl_easy *)0x0) || (((ulong)pcVar3->bits & 1) == 0)) {
      if (data != (Curl_easy *)0x0) goto LAB_00154ac2;
    }
    else {
      if ((((data->set).field_0x89f & 0x40) != 0) &&
         ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 || (0 < pcVar5->log_level))))
      {
        pcVar23 = "";
        if (bVar2 == 6) {
          pcVar23 = "a";
        }
        Curl_infof(data,"SOCKS4%s: connecting to HTTP proxy %s port %d",pcVar23,sx->hostname,
                   (ulong)(uint)sx->remote_port);
      }
LAB_00154ac2:
      if ((((data->set).field_0x89f & 0x40) != 0) &&
         ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 || (0 < pcVar5->log_level))))
      {
        Curl_infof(data,"SOCKS4 communication to %s:%d",sx->hostname,(ulong)(uint)sx->remote_port);
      }
    }
    iVar13 = sx->remote_port;
    uVar10 = (ushort)iVar13;
    sx->buffer[0] = '\x04';
    sx->buffer[1] = '\x01';
    *(ushort *)(sx->buffer + 2) = uVar10 << 8 | uVar10 >> 8;
    if (bVar2 != 6) {
      CVar11 = Curl_resolv(data,sx->hostname,iVar13,(uint)cf->conn->ip_version,true,&dns);
      if (CVar11 != CURLE_OK) {
        if (CVar11 == CURLE_AGAIN) {
          if (sx->state != CONNECT_RESOLVING) {
            sx->state = CONNECT_RESOLVING;
          }
          CVar14 = CURLPX_OK;
          if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
             ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 ||
              (0 < pcVar5->log_level)))) {
            Curl_infof(data,"SOCKS4 non-blocking resolve of %s",sx->hostname);
            CVar14 = CURLPX_OK;
          }
        }
        else {
          CVar14 = CURLPX_RESOLVE_HOST;
        }
        break;
      }
      if (sx->state != CONNECT_RESOLVED) {
        sx->state = CONNECT_RESOLVED;
      }
      pCVar20 = dns;
      if (dns != (Curl_dns_entry *)0x0) goto LAB_00154a95;
      goto switchD_001548a8_caseD_b;
    }
    if (sx->state != CONNECT_REQ_INIT) {
      sx->state = CONNECT_REQ_INIT;
    }
  case CONNECT_REQ_INIT:
switchD_001548a8_caseD_9:
    sx->buffer[8] = '\0';
    pcVar23 = sx->proxy_user;
    if (pcVar23 != (char *)0x0) {
      sVar16 = strlen(pcVar23);
      if (0xff < sVar16) {
        Curl_failf(data,"Too long SOCKS proxy username");
        CVar14 = CURLPX_LONG_USER;
        break;
      }
      memcpy(sx->buffer + 8,pcVar23,sVar16 + 1);
    }
    sVar16 = strlen((char *)(sx->buffer + 8));
    uVar21 = sVar16 + 9;
    if (bVar2 == 6) {
      sx->buffer[4] = '\0';
      sx->buffer[5] = '\0';
      sx->buffer[6] = '\0';
      sx->buffer[7] = '\x01';
      local_90 = sx->hostname;
      sVar16 = strlen(local_90);
      if ((0xff < sVar16 + 1) || (uVar24 = sVar16 + 1 + uVar21, 599 < uVar24)) {
        Curl_failf(data,"SOCKS4: too long hostname");
        CVar14 = CURLPX_LONG_HOSTNAME;
        break;
      }
      strcpy((char *)(puVar1 + uVar21),local_90);
      uVar21 = uVar24;
    }
    sx->outp = puVar1;
    sx->outstanding = uVar21;
    if (sx->state != CONNECT_REQ_SENDING) {
      sx->state = CONNECT_REQ_SENDING;
    }
switchD_001548a8_caseD_e:
    CVar14 = socks_state_send(cf,sx,data,CURLPX_SEND_CONNECT,"SOCKS4 connect request");
    if (CVar14 == CURLPX_OK) {
      if (sx->outstanding == 0) {
        sx->outstanding = 8;
        sx->outp = puVar1;
        if (sx->state != CONNECT_SOCKS_READ) {
          sx->state = CONNECT_SOCKS_READ;
        }
switchD_001548a8_caseD_4:
        CVar14 = socks_state_recv(cf,sx,data,CURLPX_RECV_CONNECT,"connect request ack");
        if (CVar14 == CURLPX_OK) {
          if (sx->outstanding != 0) goto LAB_00155b75;
          if (sx->state != CONNECT_DONE) {
            sx->state = CONNECT_DONE;
          }
switchD_001548a8_caseD_2:
          if (*puVar1 == '\0') {
            switch(sx->buffer[1]) {
            case 'Z':
              CVar14 = CURLPX_OK;
              if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
                 ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 ||
                  (0 < pcVar5->log_level)))) {
                pcVar23 = "";
                if (bVar2 == 6) {
                  pcVar23 = "a";
                }
                Curl_infof(data,"SOCKS4%s request granted.",pcVar23);
                CVar14 = CURLPX_OK;
              }
              break;
            case '[':
              Curl_failf(data,
                         "cannot complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), request rejected or failed."
                         ,(ulong)sx->buffer[4],(ulong)sx->buffer[5],(ulong)sx->buffer[6],
                         (ulong)sx->buffer[7],
                         (ulong)(ushort)(*(ushort *)(sx->buffer + 2) << 8 |
                                        *(ushort *)(sx->buffer + 2) >> 8),0x5b);
              CVar14 = CURLPX_REQUEST_FAILED;
              break;
            case '\\':
              Curl_failf(data,
                         "cannot complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), request rejected because SOCKS server cannot connect to identd on the client."
                         ,(ulong)sx->buffer[4],(ulong)sx->buffer[5],(ulong)sx->buffer[6],
                         (ulong)sx->buffer[7],
                         (ulong)(ushort)(*(ushort *)(sx->buffer + 2) << 8 |
                                        *(ushort *)(sx->buffer + 2) >> 8),0x5c);
              CVar14 = CURLPX_IDENTD;
              break;
            case ']':
              Curl_failf(data,
                         "cannot complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), request rejected because the client program and identd report different user-ids."
                         ,(ulong)sx->buffer[4],(ulong)sx->buffer[5],(ulong)sx->buffer[6],
                         (ulong)sx->buffer[7],
                         (ulong)(ushort)(*(ushort *)(sx->buffer + 2) << 8 |
                                        *(ushort *)(sx->buffer + 2) >> 8),0x5d);
              CVar14 = CURLPX_IDENTD_DIFFER;
              break;
            default:
              Curl_failf(data,"cannot complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), Unknown.",
                         (ulong)sx->buffer[4],(ulong)sx->buffer[5],(ulong)sx->buffer[6],
                         (ulong)sx->buffer[7],
                         (ulong)(ushort)(*(ushort *)(sx->buffer + 2) << 8 |
                                        *(ushort *)(sx->buffer + 2) >> 8),(ulong)sx->buffer[1]);
              CVar14 = CURLPX_UNKNOWN_FAIL;
            }
          }
          else {
            Curl_failf(data,"SOCKS4 reply has wrong version, version should be 0.");
LAB_00154f6e:
            CVar14 = CURLPX_BAD_VERSION;
          }
        }
      }
      else {
LAB_00155b75:
        CVar14 = CURLPX_OK;
      }
    }
    break;
  default:
    goto switchD_001548a8_caseD_2;
  case CONNECT_SOCKS_READ:
    goto switchD_001548a8_caseD_4;
  case CONNECT_RESOLVING:
    CVar11 = Curl_resolv_check(data,&dns);
    pCVar20 = dns;
    if (dns == (Curl_dns_entry *)0x0) {
      CVar14 = CURLPX_RESOLVE_HOST;
      if (CVar11 == CURLE_OK) {
        CVar14 = CURLPX_OK;
      }
      break;
    }
LAB_00154a95:
    while (pCVar22 = pCVar20->addr, pCVar22 != (Curl_addrinfo *)0x0) {
      if (pCVar22->ai_family == 2) {
        Curl_printable_address(pCVar22,dest,0x40);
        psVar4 = pCVar22->ai_addr;
        sx->buffer[4] = psVar4->sa_data[2];
        sx->buffer[5] = psVar4->sa_data[3];
        sx->buffer[6] = psVar4->sa_data[4];
        sx->buffer[7] = psVar4->sa_data[5];
        if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
           ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 || (0 < pcVar5->log_level))
           )) {
          Curl_infof(data,"SOCKS4 connect to IPv4 %s (locally resolved)",dest);
        }
        Curl_resolv_unlink(data,&dns);
        goto switchD_001548a8_caseD_9;
      }
      pCVar20 = (Curl_dns_entry *)&pCVar22->ai_next;
    }
    Curl_failf(data,"SOCKS4 connection to %s not supported",sx->hostname);
    CVar14 = CURLPX_RESOLVE_HOST;
    break;
  case CONNECT_RESOLVED:
switchD_001548a8_caseD_b:
    Curl_failf(data,"Failed to resolve \"%s\" for SOCKS4 connect.",sx->hostname);
    CVar14 = CURLPX_RESOLVE_HOST;
    break;
  case CONNECT_REQ_SENDING:
    goto switchD_001548a8_caseD_e;
  }
LAB_00155b7c:
  if (CVar14 == CURLPX_OK) {
    CVar11 = CURLE_OK;
    if (sx->state == CONNECT_DONE) {
      cf->field_0x24 = cf->field_0x24 | 1;
      Curl_verboseconnect(data,conn,cf->sockindex);
      if (cf->ctx != (void *)0x0) {
        (*Curl_cfree)(cf->ctx);
        cf->ctx = (void *)0x0;
      }
    }
  }
  else {
    (data->info).pxcode = CVar14;
    CVar11 = CURLE_PROXY;
  }
LAB_00155b89:
  _Var9 = (_Bool)(cf->field_0x24 & 1);
LAB_0015481e:
  *done = _Var9;
  return CVar11;
}

Assistant:

static CURLcode socks_proxy_cf_connect(struct Curl_cfilter *cf,
                                       struct Curl_easy *data,
                                       bool *done)
{
  CURLcode result;
  struct connectdata *conn = cf->conn;
  int sockindex = cf->sockindex;
  struct socks_state *sx = cf->ctx;

  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  result = cf->next->cft->do_connect(cf->next, data, done);
  if(result || !*done)
    return result;

  if(!sx) {
    sx = calloc(1, sizeof(*sx));
    if(!sx)
      return CURLE_OUT_OF_MEMORY;
    cf->ctx = sx;
  }

  if(sx->state == CONNECT_INIT) {
    /* for the secondary socket (FTP), use the "connect to host"
     * but ignore the "connect to port" (use the secondary port)
     */
    sxstate(sx, data, CONNECT_SOCKS_INIT);
    sx->hostname =
      conn->bits.httpproxy ?
      conn->http_proxy.host.name :
      conn->bits.conn_to_host ?
      conn->conn_to_host.name :
      sockindex == SECONDARYSOCKET ?
      conn->secondaryhostname : conn->host.name;
    sx->remote_port =
      conn->bits.httpproxy ? (int)conn->http_proxy.port :
      sockindex == SECONDARYSOCKET ? conn->secondary_port :
      conn->bits.conn_to_port ? conn->conn_to_port :
      conn->remote_port;
    sx->proxy_user = conn->socks_proxy.user;
    sx->proxy_password = conn->socks_proxy.passwd;
  }

  result = connect_SOCKS(cf, sx, data);
  if(!result && sx->state == CONNECT_DONE) {
    cf->connected = TRUE;
    Curl_verboseconnect(data, conn, cf->sockindex);
    socks_proxy_cf_free(cf);
  }

  *done = cf->connected;
  return result;
}